

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O2

GdlGlyphClassDefn * __thiscall GrcManager::AddAnonymousClass(GrcManager *this,GrpLineAndFile *lnf)

{
  Symbol this_00;
  GdlGlyphClassDefn *pglfc;
  string sStack_38;
  
  this_00 = GrcSymbolTable::AddAnonymousClassSymbol(this->m_psymtbl,lnf);
  if (this_00->m_pData == (GdlDefn *)0x0) {
    pglfc = (GdlGlyphClassDefn *)0x0;
  }
  else {
    pglfc = (GdlGlyphClassDefn *)
            __dynamic_cast(this_00->m_pData,&GdlDefn::typeinfo,&GdlGlyphClassDefn::typeinfo,0);
  }
  GdlRenderer::AddGlyphClass(this->m_prndr,pglfc);
  GrcSymbolTableEntry::FieldAt_abi_cxx11_(&sStack_38,this_00,0);
  std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
  std::__cxx11::string::~string((string *)&sStack_38);
  return pglfc;
}

Assistant:

GdlGlyphClassDefn * GrcManager::AddAnonymousClass(GrpLineAndFile const& lnf)
{
	Symbol psymClass = m_psymtbl->AddAnonymousClassSymbol(lnf);
	GdlGlyphClassDefn * pglfc = dynamic_cast<GdlGlyphClassDefn*>(psymClass->Data());
	Assert(pglfc);
	m_prndr->AddGlyphClass(pglfc);
	pglfc->SetName(std::string(psymClass->FieldAt(0)));
	return pglfc;
}